

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986Port(xmlURIPtr uri,char **str)

{
  bool bVar1;
  int local_2c;
  int digit;
  int port;
  char *cur;
  char **str_local;
  xmlURIPtr uri_local;
  
  _digit = *str;
  local_2c = 0;
  if (('/' < *_digit) && (*_digit < ':')) {
    while( true ) {
      bVar1 = false;
      if ('/' < *_digit) {
        bVar1 = *_digit < ':';
      }
      if (!bVar1) {
        if (uri != (xmlURIPtr)0x0) {
          uri->port = local_2c;
        }
        *str = _digit;
        return 0;
      }
      if (0xccccccc < local_2c) {
        return 1;
      }
      if (0x7fffffff - (*_digit + -0x30) < local_2c * 10) break;
      local_2c = *_digit + -0x30 + local_2c * 10;
      _digit = _digit + 1;
    }
  }
  return 1;
}

Assistant:

static int
xmlParse3986Port(xmlURIPtr uri, const char **str)
{
    const char *cur = *str;
    int port = 0;

    if (ISA_DIGIT(cur)) {
	while (ISA_DIGIT(cur)) {
            int digit = *cur - '0';

            if (port > INT_MAX / 10)
                return(1);
            port *= 10;
            if (port > INT_MAX - digit)
                return(1);
	    port += digit;

	    cur++;
	}
	if (uri != NULL)
	    uri->port = port;
	*str = cur;
	return(0);
    }
    return(1);
}